

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O2

void __thiscall
helics::EndpointInfo::disconnectFederate(EndpointInfo *this,GlobalFederateId fedToDisconnect)

{
  pointer ppVar1;
  pointer pEVar2;
  long lVar3;
  long lVar4;
  const_iterator cVar5;
  EndpointInformation *pEVar6;
  const_iterator cVar7;
  EndpointInformation *targetInfo;
  pointer __args;
  
  cVar5._M_current =
       (this->targetInformation).
       super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
       ._M_impl.super__Vector_impl_data._M_start;
  cVar7._M_current =
       (this->targetInformation).
       super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (cVar5._M_current != cVar7._M_current) {
    lVar4 = (long)cVar7._M_current - (long)cVar5._M_current;
    for (lVar3 = lVar4 / 0x48 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
      if (((cVar5._M_current)->id).fed_id.gid == fedToDisconnect.gid) goto LAB_002b31f3;
      if (cVar5._M_current[1].id.fed_id.gid == fedToDisconnect.gid) {
        cVar5._M_current = cVar5._M_current + 1;
        goto LAB_002b31f3;
      }
      if (cVar5._M_current[2].id.fed_id.gid == fedToDisconnect.gid) {
        cVar5._M_current = cVar5._M_current + 2;
        goto LAB_002b31f3;
      }
      if (cVar5._M_current[3].id.fed_id.gid == fedToDisconnect.gid) {
        cVar5._M_current = cVar5._M_current + 3;
        goto LAB_002b31f3;
      }
      cVar5._M_current = cVar5._M_current + 4;
      lVar4 = lVar4 + -0x120;
    }
    lVar4 = lVar4 / 0x48;
    if (lVar4 == 1) {
LAB_002b31d5:
      if (((cVar5._M_current)->id).fed_id.gid != fedToDisconnect.gid) {
        cVar5._M_current = cVar7._M_current;
      }
    }
    else if (lVar4 == 2) {
LAB_002b31cd:
      if (((cVar5._M_current)->id).fed_id.gid != fedToDisconnect.gid) {
        cVar5._M_current = cVar5._M_current + 1;
        goto LAB_002b31d5;
      }
    }
    else {
      if (lVar4 != 3) goto LAB_002b3290;
      if (((cVar5._M_current)->id).fed_id.gid != fedToDisconnect.gid) {
        cVar5._M_current = cVar5._M_current + 1;
        goto LAB_002b31cd;
      }
    }
LAB_002b31f3:
    pEVar6 = cVar5._M_current;
    if (cVar5._M_current != cVar7._M_current) {
      while (pEVar6 = pEVar6 + 1, pEVar6 != cVar7._M_current) {
        if ((pEVar6->id).fed_id.gid != fedToDisconnect.gid) {
          EndpointInformation::operator=(cVar5._M_current,pEVar6);
          cVar5._M_current = cVar5._M_current + 1;
        }
      }
      cVar7._M_current =
           (this->targetInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (cVar5._M_current != cVar7._M_current) {
      std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::erase
                (&this->targetInformation,cVar5,cVar7);
      ppVar1 = (this->targets).
               super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->targets).
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
        (this->targets).
        super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
      }
      pEVar2 = (this->targetInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__args = (this->targetInformation).
                    super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args != pEVar2; __args = __args + 1
          ) {
        std::
        vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
        ::emplace_back<helics::GlobalHandle_const&,std::__cxx11::string_const&>
                  ((vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
                    *)&this->targets,&__args->id,&__args->key);
      }
    }
  }
LAB_002b3290:
  pEVar6 = (this->sourceInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar5._M_current =
       (this->sourceInformation).
       super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar6 == cVar5._M_current) {
    return;
  }
  lVar4 = (long)cVar5._M_current - (long)pEVar6;
  for (lVar3 = lVar4 / 0x48 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    cVar7._M_current = pEVar6;
    if ((pEVar6->id).fed_id.gid == fedToDisconnect.gid) goto LAB_002b334c;
    if (pEVar6[1].id.fed_id.gid == fedToDisconnect.gid) {
      cVar7._M_current = pEVar6 + 1;
      goto LAB_002b334c;
    }
    if (pEVar6[2].id.fed_id.gid == fedToDisconnect.gid) {
      cVar7._M_current = pEVar6 + 2;
      goto LAB_002b334c;
    }
    if (pEVar6[3].id.fed_id.gid == fedToDisconnect.gid) {
      cVar7._M_current = pEVar6 + 3;
      goto LAB_002b334c;
    }
    pEVar6 = pEVar6 + 4;
    lVar4 = lVar4 + -0x120;
  }
  lVar4 = lVar4 / 0x48;
  if (lVar4 == 1) {
LAB_002b332e:
    cVar7._M_current = pEVar6;
    if ((pEVar6->id).fed_id.gid != fedToDisconnect.gid) {
      cVar7._M_current = cVar5._M_current;
    }
  }
  else if (lVar4 == 2) {
LAB_002b3326:
    cVar7._M_current = pEVar6;
    if ((pEVar6->id).fed_id.gid != fedToDisconnect.gid) {
      pEVar6 = pEVar6 + 1;
      goto LAB_002b332e;
    }
  }
  else {
    cVar7._M_current = cVar5._M_current;
    if (lVar4 != 3) goto LAB_002b338c;
    cVar7._M_current = pEVar6;
    if ((pEVar6->id).fed_id.gid != fedToDisconnect.gid) {
      pEVar6 = pEVar6 + 1;
      goto LAB_002b3326;
    }
  }
LAB_002b334c:
  pEVar6 = cVar7._M_current;
  if (cVar7._M_current != cVar5._M_current) {
    while (cVar7._M_current = cVar7._M_current + 1, cVar7._M_current != cVar5._M_current) {
      if (((cVar7._M_current)->id).fed_id.gid != fedToDisconnect.gid) {
        EndpointInformation::operator=(pEVar6,cVar7._M_current);
        pEVar6 = pEVar6 + 1;
      }
    }
    cVar5._M_current =
         (this->sourceInformation).
         super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    cVar7._M_current = pEVar6;
  }
LAB_002b338c:
  std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::erase
            (&this->sourceInformation,cVar7,cVar5);
  return;
}

Assistant:

void EndpointInfo::disconnectFederate(GlobalFederateId fedToDisconnect)
{
    if (!targetInformation.empty()) {
        auto removeIterator = std::remove_if(targetInformation.begin(),
                                             targetInformation.end(),
                                             [fedToDisconnect](const auto& targetInfo) {
                                                 return targetInfo.id.fed_id == fedToDisconnect;
                                             });
        if (removeIterator != targetInformation.end()) {
            targetInformation.erase(removeIterator, targetInformation.end());
            targets.clear();
            for (const auto& targetInfo : targetInformation) {
                targets.emplace_back(targetInfo.id, targetInfo.key);
            }
        }
    }
    if (!sourceInformation.empty()) {
        auto removeIterator = std::remove_if(sourceInformation.begin(),
                                             sourceInformation.end(),
                                             [fedToDisconnect](const auto& sinfo) {
                                                 return sinfo.id.fed_id == fedToDisconnect;
                                             });
        sourceInformation.erase(removeIterator, sourceInformation.end());
    }
}